

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_popup_begin(nk_context *ctx,nk_popup_type type,char *title,nk_flags flags,nk_rect rect)

{
  byte *pbVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  nk_window *pnVar4;
  nk_size nVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  nk_handle nVar8;
  nk_size nVar9;
  nk_size nVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined4 uVar15;
  int iVar16;
  nk_hash nVar17;
  nk_window *ptr;
  nk_panel *pnVar18;
  nk_panel **ppnVar19;
  nk_rect r;
  float local_58;
  float fStack_54;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x41ad,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x41ae,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x41af,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  if (pnVar4->layout != (nk_panel *)0x0) {
    if ((pnVar4->layout->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP)) !=
        NK_PANEL_NONE) {
      __assert_fail("!(panel->type & NK_PANEL_SET_POPUP) && \"popups are not allowed to have popups\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x41b6,
                    "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                   );
    }
    iVar16 = nk_strlen(title);
    nVar17 = nk_murmur_hash(title,iVar16,4);
    ptr = (pnVar4->popup).win;
    if (ptr == (nk_window *)0x0) {
      ptr = (nk_window *)nk_create_window(ctx);
      ptr->parent = pnVar4;
      (pnVar4->popup).win = ptr;
      (pnVar4->popup).active = 0;
      (pnVar4->popup).type = NK_PANEL_POPUP;
    }
    if ((pnVar4->popup).name != nVar17) {
      if ((pnVar4->popup).active != 0) {
        return 0;
      }
      nk_zero(ptr,0x1d8);
      (pnVar4->popup).name = nVar17;
      (pnVar4->popup).active = 1;
      (pnVar4->popup).type = NK_PANEL_POPUP;
    }
    ppnVar19 = &pnVar4->layout;
    ctx->current = ptr;
    uVar2 = (pnVar4->layout->clip).x;
    uVar3 = (pnVar4->layout->clip).y;
    local_58 = rect.x;
    fStack_54 = rect.y;
    ptr->parent = pnVar4;
    (ptr->bounds).x = (float)uVar2 + local_58;
    (ptr->bounds).y = (float)uVar3 + fStack_54;
    (ptr->bounds).w = (float)(int)rect._8_8_;
    (ptr->bounds).h = (float)(int)((ulong)rect._8_8_ >> 0x20);
    ptr->seq = ctx->seq;
    pnVar18 = (nk_panel *)nk_create_panel(ctx);
    ptr->layout = pnVar18;
    ptr->flags = (uint)(type == NK_POPUP_DYNAMIC) << 0xb | flags | 1;
    fVar11 = (pnVar4->buffer).clip.x;
    fVar12 = (pnVar4->buffer).clip.y;
    fVar13 = (pnVar4->buffer).clip.w;
    fVar14 = (pnVar4->buffer).clip.h;
    iVar16 = (pnVar4->buffer).use_clipping;
    uVar15 = *(undefined4 *)&(pnVar4->buffer).field_0x1c;
    nVar8 = (pnVar4->buffer).userdata;
    nVar5 = (pnVar4->buffer).begin;
    nVar9 = (pnVar4->buffer).end;
    nVar10 = (pnVar4->buffer).last;
    (ptr->buffer).base = (pnVar4->buffer).base;
    (ptr->buffer).clip.x = fVar11;
    (ptr->buffer).clip.y = fVar12;
    (ptr->buffer).clip.w = fVar13;
    (ptr->buffer).clip.h = fVar14;
    (ptr->buffer).use_clipping = iVar16;
    *(undefined4 *)&(ptr->buffer).field_0x1c = uVar15;
    (ptr->buffer).userdata = nVar8;
    (ptr->buffer).begin = nVar5;
    (ptr->buffer).end = nVar9;
    (ptr->buffer).last = nVar10;
    uVar15 = (undefined4)(pnVar4->buffer).end;
    uVar6 = *(undefined4 *)((long)&(pnVar4->buffer).end + 4);
    nVar5 = (pnVar4->buffer).last;
    uVar7 = *(undefined4 *)((long)&(pnVar4->buffer).last + 4);
    *(undefined4 *)&(pnVar4->popup).buf.begin = uVar15;
    *(undefined4 *)((long)&(pnVar4->popup).buf.begin + 4) = uVar6;
    *(int *)&(pnVar4->popup).buf.parent = (int)nVar5;
    *(undefined4 *)((long)&(pnVar4->popup).buf.parent + 4) = uVar7;
    *(undefined4 *)&(pnVar4->popup).buf.last = uVar15;
    *(undefined4 *)((long)&(pnVar4->popup).buf.last + 4) = uVar6;
    *(undefined4 *)&(pnVar4->popup).buf.end = uVar15;
    *(undefined4 *)((long)&(pnVar4->popup).buf.end + 4) = uVar6;
    (pnVar4->popup).buf.active = 1;
    nVar5 = (ctx->memory).allocated;
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&ptr->buffer,r);
    iVar16 = nk_panel_begin(ctx,title,NK_PANEL_POPUP);
    if (iVar16 == 0) {
      while (pnVar18 = *ppnVar19, pnVar18 != (nk_panel *)0x0) {
        pbVar1 = (byte *)((long)&pnVar18->flags + 2);
        *pbVar1 = *pbVar1 | 1;
        ppnVar19 = &pnVar18->parent;
      }
      (pnVar4->popup).buf.active = 0;
      (pnVar4->popup).active = 0;
      (ctx->memory).allocated = nVar5;
      ctx->current = pnVar4;
      nk_free_page_element(ctx,(nk_page_element *)ptr->layout);
      ptr->layout = (nk_panel *)0x0;
      iVar16 = 0;
    }
    else {
      while (pnVar18 = *ppnVar19, pnVar18 != (nk_panel *)0x0) {
        pnVar18->flags = pnVar18->flags & 0xfffeefff | 0x1000;
        ppnVar19 = &pnVar18->parent;
      }
      (pnVar4->popup).active = 1;
      pnVar18 = ptr->layout;
      pnVar18->offset_x = &(ptr->scrollbar).x;
      pnVar18->offset_y = &(ptr->scrollbar).y;
      pnVar18->parent = pnVar4->layout;
      iVar16 = 1;
    }
    return iVar16;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x41b0,
                "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
               );
}

Assistant:

NK_API int
nk_popup_begin(struct nk_context *ctx, enum nk_popup_type type,
    const char *title, nk_flags flags, struct nk_rect rect)
{
    struct nk_window *popup;
    struct nk_window *win;
    struct nk_panel *panel;

    int title_len;
    nk_hash title_hash;
    nk_size allocated;

    NK_ASSERT(ctx);
    NK_ASSERT(title);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    panel = win->layout;
    NK_ASSERT(!(panel->type & NK_PANEL_SET_POPUP) && "popups are not allowed to have popups");
    (void)panel;
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_POPUP);

    popup = win->popup.win;
    if (!popup) {
        popup = (struct nk_window*)nk_create_window(ctx);
        popup->parent = win;
        win->popup.win = popup;
        win->popup.active = 0;
        win->popup.type = NK_PANEL_POPUP;
    }

    /* make sure we have correct popup */
    if (win->popup.name != title_hash) {
        if (!win->popup.active) {
            nk_zero(popup, sizeof(*popup));
            win->popup.name = title_hash;
            win->popup.active = 1;
            win->popup.type = NK_PANEL_POPUP;
        } else return 0;
    }

    /* popup position is local to window */
    ctx->current = popup;
    rect.x += win->layout->clip.x;
    rect.y += win->layout->clip.y;

    /* setup popup data */
    popup->parent = win;
    popup->bounds = rect;
    popup->seq = ctx->seq;
    popup->layout = (struct nk_panel*)nk_create_panel(ctx);
    popup->flags = flags;
    popup->flags |= NK_WINDOW_BORDER;
    if (type == NK_POPUP_DYNAMIC)
        popup->flags |= NK_WINDOW_DYNAMIC;

    popup->buffer = win->buffer;
    nk_start_popup(ctx, win);
    allocated = ctx->memory.allocated;
    nk_push_scissor(&popup->buffer, nk_null_rect);

    if (nk_panel_begin(ctx, title, NK_PANEL_POPUP)) {
        /* popup is running therefore invalidate parent panels */
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_ROM;
            root->flags &= ~(nk_flags)NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->popup.active = 1;
        popup->layout->offset_x = &popup->scrollbar.x;
        popup->layout->offset_y = &popup->scrollbar.y;
        popup->layout->parent = win->layout;
        return 1;
    } else {
        /* popup was closed/is invalid so cleanup */
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->popup.buf.active = 0;
        win->popup.active = 0;
        ctx->memory.allocated = allocated;
        ctx->current = win;
        nk_free_panel(ctx, popup->layout);
        popup->layout = 0;
        return 0;
    }
}